

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_SignatureVerification_Test::TestBody
          (X509Test_SignatureVerification_Test *this)

{
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  initializer_list<x509_st_*> __l_11;
  initializer_list<x509_st_*> __l_12;
  initializer_list<x509_st_*> __l_13;
  initializer_list<x509_st_*> __l_14;
  initializer_list<x509_st_*> __l_15;
  initializer_list<x509_st_*> __l_16;
  initializer_list<x509_st_*> __l_17;
  initializer_list<x509_st_*> __l_18;
  initializer_list<x509_st_*> __l_19;
  initializer_list<x509_st_*> __l_20;
  initializer_list<x509_st_*> __l_21;
  initializer_list<x509_st_*> __l_22;
  initializer_list<x509_st_*> __l_23;
  initializer_list<x509_st_*> __l_24;
  initializer_list<x509_st_*> __l_25;
  initializer_list<x509_st_*> __l_26;
  initializer_list<x509_st_*> __l_27;
  initializer_list<x509_st_*> __l_28;
  initializer_list<x509_st_*> __l_29;
  initializer_list<x509_st_*> __l_30;
  initializer_list<x509_st_*> __l_31;
  initializer_list<x509_st_*> __l_32;
  initializer_list<x509_st_*> __l_33;
  initializer_list<x509_st_*> __l_34;
  initializer_list<x509_st_*> __l_35;
  initializer_list<x509_st_*> __l_36;
  bool bVar1;
  char *pcVar2;
  pointer pxVar3;
  char *in_R9;
  AssertHelper local_1490;
  Message local_1488;
  anon_class_1_0_00000001 local_1479;
  function<void_(x509_store_ctx_st_*)> local_1478;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_1458;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1438;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1418;
  int local_1400 [2];
  undefined1 local_13f8 [8];
  AssertionResult gtest_ar_23;
  Message local_13e0;
  function<void_(x509_store_ctx_st_*)> local_13d8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_13b8;
  allocator<x509_st_*> local_1399;
  pointer local_1398;
  iterator local_1390;
  size_type local_1388;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1380;
  allocator<x509_st_*> local_1361;
  pointer local_1360;
  iterator local_1358;
  size_type local_1350;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1348;
  int local_1330 [2];
  undefined1 local_1328 [8];
  AssertionResult gtest_ar_22;
  Message local_1310;
  function<void_(x509_store_ctx_st_*)> local_1308;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_12e8;
  allocator<x509_st_*> local_12c9;
  pointer local_12c8;
  iterator local_12c0;
  size_type local_12b8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_12b0;
  allocator<x509_st_*> local_1291;
  pointer local_1290;
  iterator local_1288;
  size_type local_1280;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1278;
  int local_1260 [2];
  undefined1 local_1258 [8];
  AssertionResult gtest_ar_21;
  Message local_1240;
  function<void_(x509_store_ctx_st_*)> local_1238;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_1218;
  allocator<x509_st_*> local_11f9;
  pointer local_11f8;
  iterator local_11f0;
  size_type local_11e8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_11e0;
  allocator<x509_st_*> local_11c1;
  pointer local_11c0;
  iterator local_11b8;
  size_type local_11b0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_11a8;
  int local_1190 [2];
  undefined1 local_1188 [8];
  AssertionResult gtest_ar_20;
  Message local_1170;
  function<void_(x509_store_ctx_st_*)> local_1168;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_1148;
  allocator<x509_st_*> local_1129;
  pointer local_1128;
  iterator local_1120;
  size_type local_1118;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1110;
  allocator<x509_st_*> local_10f1;
  pointer local_10f0;
  iterator local_10e8;
  size_type local_10e0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_10d8;
  int local_10c0 [2];
  undefined1 local_10b8 [8];
  AssertionResult gtest_ar_19;
  Message local_10a0;
  function<void_(x509_store_ctx_st_*)> local_1098;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_1078;
  allocator<x509_st_*> local_1059;
  pointer local_1058;
  iterator local_1050;
  size_type local_1048;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1040;
  allocator<x509_st_*> local_1021;
  pointer local_1020;
  iterator local_1018;
  size_type local_1010;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1008;
  int local_ff0 [2];
  undefined1 local_fe8 [8];
  AssertionResult gtest_ar_18;
  Message local_fd0;
  function<void_(x509_store_ctx_st_*)> local_fc8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_fa8;
  allocator<x509_st_*> local_f89;
  pointer local_f88;
  iterator local_f80;
  size_type local_f78;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_f70;
  allocator<x509_st_*> local_f51;
  pointer local_f50;
  iterator local_f48;
  size_type local_f40;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_f38;
  int local_f20 [2];
  undefined1 local_f18 [8];
  AssertionResult gtest_ar_17;
  Message local_f00;
  function<void_(x509_store_ctx_st_*)> local_ef8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_ed8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_eb8;
  allocator<x509_st_*> local_e91;
  pointer local_e90;
  iterator local_e88;
  size_type local_e80;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_e78;
  int local_e60 [2];
  undefined1 local_e58 [8];
  AssertionResult gtest_ar_16;
  Message local_e40;
  function<void_(x509_store_ctx_st_*)> local_e38;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_e18;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_df8;
  allocator<x509_st_*> local_dd1;
  pointer local_dd0;
  iterator local_dc8;
  size_type local_dc0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_db8;
  int local_da0 [2];
  undefined1 local_d98 [8];
  AssertionResult gtest_ar_15;
  Message local_d80;
  function<void_(x509_store_ctx_st_*)> local_d78;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_d58;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_d38;
  allocator<x509_st_*> local_d11;
  pointer local_d10;
  iterator local_d08;
  size_type local_d00;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_cf8;
  int local_ce0 [2];
  undefined1 local_cd8 [8];
  AssertionResult gtest_ar_14;
  Message local_cc0;
  function<void_(x509_store_ctx_st_*)> local_cb8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_c98;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_c78;
  allocator<x509_st_*> local_c51;
  pointer local_c50;
  iterator local_c48;
  size_type local_c40;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_c38;
  int local_c20 [2];
  undefined1 local_c18 [8];
  AssertionResult gtest_ar_13;
  Message local_c00;
  function<void_(x509_store_ctx_st_*)> local_bf8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_bd8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_bb8;
  allocator<x509_st_*> local_b91;
  pointer local_b90;
  iterator local_b88;
  size_type local_b80;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_b78;
  int local_b60 [2];
  undefined1 local_b58 [8];
  AssertionResult gtest_ar_12;
  Message local_b40;
  function<void_(x509_store_ctx_st_*)> local_b38;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_b18;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_af8;
  allocator<x509_st_*> local_ad1;
  pointer local_ad0;
  iterator local_ac8;
  size_type local_ac0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_ab8;
  int local_aa0 [2];
  undefined1 local_a98 [8];
  AssertionResult gtest_ar_11;
  Message local_a80;
  function<void_(x509_store_ctx_st_*)> local_a78;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_a58;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_a38;
  allocator<x509_st_*> local_a11;
  pointer local_a10;
  iterator local_a08;
  size_type local_a00;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_9f8;
  int local_9e0 [2];
  undefined1 local_9d8 [8];
  AssertionResult gtest_ar_10;
  Message local_9c0;
  function<void_(x509_store_ctx_st_*)> local_9b8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_998;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_978;
  allocator<x509_st_*> local_951;
  pointer local_950;
  iterator local_948;
  size_type local_940;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_938;
  int local_920 [2];
  undefined1 local_918 [8];
  AssertionResult gtest_ar_9;
  Message local_900;
  function<void_(x509_store_ctx_st_*)> local_8f8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_8d8;
  allocator<x509_st_*> local_8b9;
  pointer local_8b8;
  iterator local_8b0;
  size_type local_8a8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_8a0;
  allocator<x509_st_*> local_881;
  pointer local_880;
  iterator local_878;
  size_type local_870;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_868;
  int local_850 [2];
  undefined1 local_848 [8];
  AssertionResult gtest_ar_8;
  Message local_830;
  function<void_(x509_store_ctx_st_*)> local_828;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_808;
  allocator<x509_st_*> local_7e9;
  pointer local_7e8;
  iterator local_7e0;
  size_type local_7d8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_7d0;
  allocator<x509_st_*> local_7b1;
  pointer local_7b0;
  iterator local_7a8;
  size_type local_7a0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_798;
  int local_780 [2];
  undefined1 local_778 [8];
  AssertionResult gtest_ar_7;
  Message local_760;
  function<void_(x509_store_ctx_st_*)> local_758;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_738;
  allocator<x509_st_*> local_719;
  pointer local_718;
  iterator local_710;
  size_type local_708;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_700;
  allocator<x509_st_*> local_6e1;
  pointer local_6e0;
  iterator local_6d8;
  size_type local_6d0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_6c8;
  int local_6b0 [2];
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_6;
  Message local_690;
  function<void_(x509_store_ctx_st_*)> local_688;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_668;
  allocator<x509_st_*> local_649;
  pointer local_648;
  iterator local_640;
  size_type local_638;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_630;
  allocator<x509_st_*> local_611;
  pointer local_610;
  iterator local_608;
  size_type local_600;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_5f8;
  int local_5e0 [2];
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_5;
  Message local_5c0;
  function<void_(x509_store_ctx_st_*)> local_5b8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_598;
  allocator<x509_st_*> local_579;
  pointer local_578;
  iterator local_570;
  size_type local_568;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_560;
  allocator<x509_st_*> local_541;
  pointer local_540;
  iterator local_538;
  size_type local_530;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_528;
  int local_510 [2];
  undefined1 local_508 [8];
  AssertionResult gtest_ar_4;
  Message local_4f0;
  function<void_(x509_store_ctx_st_*)> local_4e8;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_4c8;
  allocator<x509_st_*> local_4a9;
  pointer local_4a8;
  iterator local_4a0;
  size_type local_498;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_490;
  allocator<x509_st_*> local_471;
  pointer local_470;
  iterator local_468;
  size_type local_460;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_458;
  int local_440 [2];
  undefined1 local_438 [8];
  AssertionResult gtest_ar_3;
  Message local_420;
  function<void_(x509_store_ctx_st_*)> local_418;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_3f8;
  allocator<x509_st_*> local_3d9;
  pointer local_3d8;
  iterator local_3d0;
  size_type local_3c8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_3c0;
  allocator<x509_st_*> local_3a1;
  pointer local_3a0;
  iterator local_398;
  size_type local_390;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_388;
  int local_370 [2];
  undefined1 local_368 [8];
  AssertionResult gtest_ar_2;
  Message local_350;
  function<void_(x509_store_ctx_st_*)> local_348;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_328;
  allocator<x509_st_*> local_309;
  pointer local_308;
  iterator local_300;
  size_type local_2f8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2f0;
  allocator<x509_st_*> local_2d1;
  pointer local_2d0;
  iterator local_2c8;
  size_type local_2c0;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_2b8;
  int local_2a0 [2];
  undefined1 local_298 [8];
  AssertionResult gtest_ar_1;
  Message local_280;
  function<void_(x509_store_ctx_st_*)> local_278;
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_258;
  allocator<x509_st_*> local_231;
  pointer local_230;
  iterator local_228;
  size_type local_220;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_218;
  allocator<x509_st_*> local_1f9;
  pointer local_1f8;
  iterator local_1f0;
  size_type local_1e8;
  vector<x509_st_*,_std::allocator<x509_st_*>_> local_1e0;
  int local_1c8 [2];
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__3;
  Certs leaf;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__2;
  Certs intermediate;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  Certs root;
  anon_class_8_1_ba1d59bf make_certs;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> key;
  X509Test_SignatureVerification_Test *this_local;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_52317d *)&gtest_ar_.message_,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x8f28b1,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x117c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    root.bad_sig._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)&gtest_ar_.message_;
    TestBody::anon_class_8_1_ba1d59bf::operator()
              ((Certs *)&gtest_ar__1.message_,(anon_class_8_1_ba1d59bf *)&root.bad_sig,"Root","Root"
               ,true);
    testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_b0,
               (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&intermediate.bad_sig,(internal *)local_b0,
                 (AssertionResult *)"root.valid","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x11c7,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&intermediate.bad_sig);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if (bVar1) {
      TestBody::anon_class_8_1_ba1d59bf::operator()
                ((Certs *)&gtest_ar__2.message_,(anon_class_8_1_ba1d59bf *)&root.bad_sig,"Root",
                 "Intermediate",true);
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_118,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
      if (!bVar1) {
        testing::Message::Message(&local_120);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&leaf.bad_sig,(internal *)local_118,
                   (AssertionResult *)"intermediate.valid","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x11c9,pcVar2);
        testing::internal::AssertHelper::operator=(&local_128,&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_128);
        std::__cxx11::string::~string((string *)&leaf.bad_sig);
        testing::Message::~Message(&local_120);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
      if (bVar1) {
        TestBody::anon_class_8_1_ba1d59bf::operator()
                  ((Certs *)&gtest_ar__3.message_,(anon_class_8_1_ba1d59bf *)&root.bad_sig,
                   "Intermediate","Leaf",false);
        testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_180,
                   (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_,(type *)0x0
                  );
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
        if (!bVar1) {
          testing::Message::Message(&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_180,
                     (AssertionResult *)"leaf.valid","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x11cb,pcVar2);
          testing::internal::AssertHelper::operator=(&local_190,&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_188);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
        if (bVar1) {
          local_1c8[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_1f8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_1f0 = &local_1f8;
          local_1e8 = 1;
          std::allocator<x509_st_*>::allocator(&local_1f9);
          __l_36._M_len = local_1e8;
          __l_36._M_array = local_1f0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1e0,__l_36,&local_1f9);
          local_230 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_228 = &local_230;
          local_220 = 1;
          std::allocator<x509_st_*>::allocator(&local_231);
          __l_35._M_len = local_220;
          __l_35._M_array = local_228;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_218,__l_35,&local_231);
          local_258.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_258.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_258.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_258);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_278,(nullptr_t)0x0);
          local_1c8[0] = Verify(pxVar3,&local_1e0,&local_218,&local_258,0,&local_278);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1c0,"0",
                     "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.valid.get()}, {})",
                     local_1c8 + 1,local_1c8);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_278);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_258);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_218);
          std::allocator<x509_st_*>::~allocator(&local_231);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1e0);
          std::allocator<x509_st_*>::~allocator(&local_1f9);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar1) {
            testing::Message::Message(&local_280);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11cf,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_280);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_280);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          local_2a0[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.bad_sig_type);
          local_2d0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_2c8 = &local_2d0;
          local_2c0 = 1;
          std::allocator<x509_st_*>::allocator(&local_2d1);
          __l_34._M_len = local_2c0;
          __l_34._M_array = local_2c8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_2b8,__l_34,&local_2d1);
          local_308 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_300 = &local_308;
          local_2f8 = 1;
          std::allocator<x509_st_*>::allocator(&local_309);
          __l_33._M_len = local_2f8;
          __l_33._M_array = local_300;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_2f0,__l_33,&local_309);
          local_328.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_328.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_328.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_328);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_348,(nullptr_t)0x0);
          local_2a0[0] = Verify(pxVar3,&local_2b8,&local_2f0,&local_328,0,&local_348);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_298,"7",
                     "Verify(leaf.bad_sig.get(), {root.valid.get()}, {intermediate.valid.get()}, {})"
                     ,local_2a0 + 1,local_2a0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_348);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_328);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2f0);
          std::allocator<x509_st_*>::~allocator(&local_309);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_2b8);
          std::allocator<x509_st_*>::~allocator(&local_2d1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
          if (!bVar1) {
            testing::Message::Message(&local_350);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11d4,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_350);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_350);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
          local_370[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.bad_key);
          local_3a0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_398 = &local_3a0;
          local_390 = 1;
          std::allocator<x509_st_*>::allocator(&local_3a1);
          __l_32._M_len = local_390;
          __l_32._M_array = local_398;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_388,__l_32,&local_3a1);
          local_3d8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_3d0 = &local_3d8;
          local_3c8 = 1;
          std::allocator<x509_st_*>::allocator(&local_3d9);
          __l_31._M_len = local_3c8;
          __l_31._M_array = local_3d0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_3c0,__l_31,&local_3d9);
          local_3f8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_3f8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3f8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_3f8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_418,(nullptr_t)0x0);
          local_370[0] = Verify(pxVar3,&local_388,&local_3c0,&local_3f8,0,&local_418);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_368,"7",
                     "Verify(leaf.bad_sig_type.get(), {root.valid.get()}, {intermediate.valid.get()}, {})"
                     ,local_370 + 1,local_370);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_418);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_3f8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_3c0);
          std::allocator<x509_st_*>::~allocator(&local_3d9);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_388);
          std::allocator<x509_st_*>::~allocator(&local_3a1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
          if (!bVar1) {
            testing::Message::Message(&local_420);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11d7,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_3.message_,&local_420);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
            testing::Message::~Message(&local_420);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
          local_440[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_470 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_468 = &local_470;
          local_460 = 1;
          std::allocator<x509_st_*>::allocator(&local_471);
          __l_30._M_len = local_460;
          __l_30._M_array = local_468;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_458,__l_30,&local_471);
          local_4a8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                (&intermediate.bad_sig_type);
          local_4a0 = &local_4a8;
          local_498 = 1;
          std::allocator<x509_st_*>::allocator(&local_4a9);
          __l_29._M_len = local_498;
          __l_29._M_array = local_4a0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_490,__l_29,&local_4a9);
          local_4c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_4c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_4c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_4c8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_4e8,(nullptr_t)0x0);
          local_440[0] = Verify(pxVar3,&local_458,&local_490,&local_4c8,0,&local_4e8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_438,"7",
                     "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_sig.get()}, {})"
                     ,local_440 + 1,local_440);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_4e8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_4c8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_490);
          std::allocator<x509_st_*>::~allocator(&local_4a9);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_458);
          std::allocator<x509_st_*>::~allocator(&local_471);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
          if (!bVar1) {
            testing::Message::Message(&local_4f0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11da,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_4f0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_4f0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
          local_510[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_540 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__1.message_);
          local_538 = &local_540;
          local_530 = 1;
          std::allocator<x509_st_*>::allocator(&local_541);
          __l_28._M_len = local_530;
          __l_28._M_array = local_538;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_528,__l_28,&local_541);
          local_578 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&intermediate.bad_key);
          local_570 = &local_578;
          local_568 = 1;
          std::allocator<x509_st_*>::allocator(&local_579);
          __l_27._M_len = local_568;
          __l_27._M_array = local_570;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_560,__l_27,&local_579);
          local_598.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_598.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_598.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_598);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_5b8,(nullptr_t)0x0);
          local_510[0] = Verify(pxVar3,&local_528,&local_560,&local_598,0,&local_5b8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_508,"7",
                     "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_sig_type.get()}, {})"
                     ,local_510 + 1,local_510);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_5b8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_598);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_560);
          std::allocator<x509_st_*>::~allocator(&local_579);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_528);
          std::allocator<x509_st_*>::~allocator(&local_541);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
          if (!bVar1) {
            testing::Message::Message(&local_5c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11dd,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_5c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_5c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
          local_5e0[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_610 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_sig_type);
          local_608 = &local_610;
          local_600 = 1;
          std::allocator<x509_st_*>::allocator(&local_611);
          __l_26._M_len = local_600;
          __l_26._M_array = local_608;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_5f8,__l_26,&local_611);
          local_648 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_640 = &local_648;
          local_638 = 1;
          std::allocator<x509_st_*>::allocator(&local_649);
          __l_25._M_len = local_638;
          __l_25._M_array = local_640;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_630,__l_25,&local_649);
          local_668.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_668.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_668.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_668);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_688,(nullptr_t)0x0);
          local_5e0[0] = Verify(pxVar3,&local_5f8,&local_630,&local_668,0,&local_688);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_5d8,"0",
                     "Verify(leaf.valid.get(), {root.bad_sig.get()}, {intermediate.valid.get()}, {})"
                     ,local_5e0 + 1,local_5e0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_688);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_668);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_630);
          std::allocator<x509_st_*>::~allocator(&local_649);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_5f8);
          std::allocator<x509_st_*>::~allocator(&local_611);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
          if (!bVar1) {
            testing::Message::Message(&local_690);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11e1,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_690);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_690);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
          local_6b0[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_6e0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key);
          local_6d8 = &local_6e0;
          local_6d0 = 1;
          std::allocator<x509_st_*>::allocator(&local_6e1);
          __l_24._M_len = local_6d0;
          __l_24._M_array = local_6d8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_6c8,__l_24,&local_6e1);
          local_718 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_710 = &local_718;
          local_708 = 1;
          std::allocator<x509_st_*>::allocator(&local_719);
          __l_23._M_len = local_708;
          __l_23._M_array = local_710;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_700,__l_23,&local_719);
          local_738.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_738.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_738.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_738);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_758,(nullptr_t)0x0);
          local_6b0[0] = Verify(pxVar3,&local_6c8,&local_700,&local_738,0,&local_758);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_6a8,"0",
                     "Verify(leaf.valid.get(), {root.bad_sig_type.get()}, {intermediate.valid.get()}, {})"
                     ,local_6b0 + 1,local_6b0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_758);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_738);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_700);
          std::allocator<x509_st_*>::~allocator(&local_719);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_6c8);
          std::allocator<x509_st_*>::~allocator(&local_6e1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
          if (!bVar1) {
            testing::Message::Message(&local_760);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11e3,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_760);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_760);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
          local_780[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_7b0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_sig_type);
          local_7a8 = &local_7b0;
          local_7a0 = 1;
          std::allocator<x509_st_*>::allocator(&local_7b1);
          __l_22._M_len = local_7a0;
          __l_22._M_array = local_7a8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_798,__l_22,&local_7b1);
          local_7e8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_7e0 = &local_7e8;
          local_7d8 = 1;
          std::allocator<x509_st_*>::allocator(&local_7e9);
          __l_21._M_len = local_7d8;
          __l_21._M_array = local_7e0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_7d0,__l_21,&local_7e9);
          local_808.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_808.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_808.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_808);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_828,(nullptr_t)0x0);
          local_780[0] = Verify(pxVar3,&local_798,&local_7d0,&local_808,0x4000,&local_828);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_778,"7",
                     "Verify(leaf.valid.get(), {root.bad_sig.get()}, {intermediate.valid.get()}, {}, 0x4000)"
                     ,local_780 + 1,local_780);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_828);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_808);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_7d0);
          std::allocator<x509_st_*>::~allocator(&local_7e9);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_798);
          std::allocator<x509_st_*>::~allocator(&local_7b1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
          if (!bVar1) {
            testing::Message::Message(&local_830);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11e9,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_830);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_830);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
          local_850[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_880 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key);
          local_878 = &local_880;
          local_870 = 1;
          std::allocator<x509_st_*>::allocator(&local_881);
          __l_20._M_len = local_870;
          __l_20._M_array = local_878;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_868,__l_20,&local_881);
          local_8b8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_8b0 = &local_8b8;
          local_8a8 = 1;
          std::allocator<x509_st_*>::allocator(&local_8b9);
          __l_19._M_len = local_8a8;
          __l_19._M_array = local_8b0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_8a0,__l_19,&local_8b9);
          local_8d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_8d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_8d8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_8d8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_8f8,(nullptr_t)0x0);
          local_850[0] = Verify(pxVar3,&local_868,&local_8a0,&local_8d8,0x4000,&local_8f8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_848,"7",
                     "Verify(leaf.valid.get(), {root.bad_sig_type.get()}, {intermediate.valid.get()}, {}, 0x4000)"
                     ,local_850 + 1,local_850);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_8f8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_8d8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_8a0);
          std::allocator<x509_st_*>::~allocator(&local_8b9);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_868);
          std::allocator<x509_st_*>::~allocator(&local_881);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
          if (!bVar1) {
            testing::Message::Message(&local_900);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11ed,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_900);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_900);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
          local_920[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_sig_type);
          local_950 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_sig_type);
          local_948 = &local_950;
          local_940 = 1;
          std::allocator<x509_st_*>::allocator(&local_951);
          __l_18._M_len = local_940;
          __l_18._M_array = local_948;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_938,__l_18,&local_951);
          local_978.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_978.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_978.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_978);
          local_998.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_998.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_998.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_998);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_9b8,(nullptr_t)0x0);
          local_920[0] = Verify(pxVar3,&local_938,&local_978,&local_998,0,&local_9b8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_918,"0",
                     "Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {})",local_920 + 1,
                     local_920);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_9b8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_998);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_978);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_938);
          std::allocator<x509_st_*>::~allocator(&local_951);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_918);
          if (!bVar1) {
            testing::Message::Message(&local_9c0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_918);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11f2,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_10.message_,&local_9c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
            testing::Message::~Message(&local_9c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_918);
          local_9e0[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key);
          local_a10 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key);
          local_a08 = &local_a10;
          local_a00 = 1;
          std::allocator<x509_st_*>::allocator(&local_a11);
          __l_17._M_len = local_a00;
          __l_17._M_array = local_a08;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_9f8,__l_17,&local_a11);
          local_a38.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a38.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a38.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_a38);
          local_a58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_a58);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_a78,(nullptr_t)0x0);
          local_9e0[0] = Verify(pxVar3,&local_9f8,&local_a38,&local_a58,0,&local_a78);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_9d8,"0",
                     "Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {})",
                     local_9e0 + 1,local_9e0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_a78);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_a58);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_a38);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_9f8);
          std::allocator<x509_st_*>::~allocator(&local_a11);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
          if (!bVar1) {
            testing::Message::Message(&local_a80);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_9d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11f4,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_11.message_,&local_a80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
            testing::Message::~Message(&local_a80);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
          local_aa0[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_sig_type);
          local_ad0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_sig_type);
          local_ac8 = &local_ad0;
          local_ac0 = 1;
          std::allocator<x509_st_*>::allocator(&local_ad1);
          __l_16._M_len = local_ac0;
          __l_16._M_array = local_ac8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_ab8,__l_16,&local_ad1);
          local_af8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_af8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_af8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_af8);
          local_b18.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b18.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_b18.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_b18);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_b38,(nullptr_t)0x0);
          local_aa0[0] = Verify(pxVar3,&local_ab8,&local_af8,&local_b18,0x4000,&local_b38);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_a98,"7",
                     "Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {}, 0x4000)",
                     local_aa0 + 1,local_aa0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_b38);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_b18);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_af8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_ab8);
          std::allocator<x509_st_*>::~allocator(&local_ad1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a98);
          if (!bVar1) {
            testing::Message::Message(&local_b40);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a98);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11f7,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_12.message_,&local_b40);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
            testing::Message::~Message(&local_b40);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_a98);
          local_b60[1] = 7;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key);
          local_b90 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key);
          local_b88 = &local_b90;
          local_b80 = 1;
          std::allocator<x509_st_*>::allocator(&local_b91);
          __l_15._M_len = local_b80;
          __l_15._M_array = local_b88;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_b78,__l_15,&local_b91);
          local_bb8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_bb8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_bb8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_bb8);
          local_bd8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_bd8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_bd8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_bd8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_bf8,(nullptr_t)0x0);
          local_b60[0] = Verify(pxVar3,&local_b78,&local_bb8,&local_bd8,0x4000,&local_bf8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_b58,"7",
                     "Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {}, 0x4000)",
                     local_b60 + 1,local_b60);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_bf8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_bd8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_bb8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_b78);
          std::allocator<x509_st_*>::~allocator(&local_b91);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b58);
          if (!bVar1) {
            testing::Message::Message(&local_c00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b58);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x11fa,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_13.message_,&local_c00);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
            testing::Message::~Message(&local_c00);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b58);
          local_c20[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_c50 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                (&intermediate.bad_sig_type);
          local_c48 = &local_c50;
          local_c40 = 1;
          std::allocator<x509_st_*>::allocator(&local_c51);
          __l_14._M_len = local_c40;
          __l_14._M_array = local_c48;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_c38,__l_14,&local_c51);
          local_c78.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c78.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c78.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_c78);
          local_c98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c98.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_c98);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_cb8,(nullptr_t)0x0);
          local_c20[0] = Verify(pxVar3,&local_c38,&local_c78,&local_c98,0x84000,&local_cb8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_c18,"0",
                     "Verify(leaf.valid.get(), {intermediate.bad_sig.get()}, {}, {}, 0x4000 | 0x80000)"
                     ,local_c20 + 1,local_c20);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_cb8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_c98);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_c78);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_c38);
          std::allocator<x509_st_*>::~allocator(&local_c51);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
          if (!bVar1) {
            testing::Message::Message(&local_cc0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c18);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1201,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_14.message_,&local_cc0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
            testing::Message::~Message(&local_cc0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
          local_ce0[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_d10 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&intermediate.bad_key);
          local_d08 = &local_d10;
          local_d00 = 1;
          std::allocator<x509_st_*>::allocator(&local_d11);
          __l_13._M_len = local_d00;
          __l_13._M_array = local_d08;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_cf8,__l_13,&local_d11);
          local_d38.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d38.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d38.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_d38);
          local_d58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d58.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_d58);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_d78,(nullptr_t)0x0);
          local_ce0[0] = Verify(pxVar3,&local_cf8,&local_d38,&local_d58,0x84000,&local_d78);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_cd8,"0",
                     "Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {}, 0x4000 | 0x80000)"
                     ,local_ce0 + 1,local_ce0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_d78);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_d58);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_d38);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_cf8);
          std::allocator<x509_st_*>::~allocator(&local_d11);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cd8);
          if (!bVar1) {
            testing::Message::Message(&local_d80);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_cd8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1204,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_15.message_,&local_d80);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
            testing::Message::~Message(&local_d80);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_cd8);
          local_da0[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_dd0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                (&intermediate.bad_sig_type);
          local_dc8 = &local_dd0;
          local_dc0 = 1;
          std::allocator<x509_st_*>::allocator(&local_dd1);
          __l_12._M_len = local_dc0;
          __l_12._M_array = local_dc8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_db8,__l_12,&local_dd1);
          local_df8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_df8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_df8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_df8);
          local_e18.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e18.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e18.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_e18);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_e38,(nullptr_t)0x0);
          local_da0[0] = Verify(pxVar3,&local_db8,&local_df8,&local_e18,0x80000,&local_e38);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_d98,"0",
                     "Verify(leaf.valid.get(), {intermediate.bad_sig.get()}, {}, {}, 0x80000)",
                     local_da0 + 1,local_da0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_e38);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_e18);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_df8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_db8);
          std::allocator<x509_st_*>::~allocator(&local_dd1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d98);
          if (!bVar1) {
            testing::Message::Message(&local_e40);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d98);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1206,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_16.message_,&local_e40);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
            testing::Message::~Message(&local_e40);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d98);
          local_e60[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_e90 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&intermediate.bad_key);
          local_e88 = &local_e90;
          local_e80 = 1;
          std::allocator<x509_st_*>::allocator(&local_e91);
          __l_11._M_len = local_e80;
          __l_11._M_array = local_e88;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_e78,__l_11,&local_e91);
          local_eb8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_eb8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_eb8.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_eb8);
          local_ed8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_ed8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_ed8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_ed8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_ef8,(nullptr_t)0x0);
          local_e60[0] = Verify(pxVar3,&local_e78,&local_eb8,&local_ed8,0x80000,&local_ef8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_e58,"0",
                     "Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {}, 0x80000)",
                     local_e60 + 1,local_e60);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_ef8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_ed8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_eb8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_e78);
          std::allocator<x509_st_*>::~allocator(&local_e91);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e58);
          if (!bVar1) {
            testing::Message::Message(&local_f00);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e58);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1209,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_17.message_,&local_f00);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
            testing::Message::~Message(&local_f00);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_e58);
          local_f20[1] = 6;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_f50 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.bad_key_type);
          local_f48 = &local_f50;
          local_f40 = 1;
          std::allocator<x509_st_*>::allocator(&local_f51);
          __l_10._M_len = local_f40;
          __l_10._M_array = local_f48;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_f38,__l_10,&local_f51);
          local_f88 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          local_f80 = &local_f88;
          local_f78 = 1;
          std::allocator<x509_st_*>::allocator(&local_f89);
          __l_09._M_len = local_f78;
          __l_09._M_array = local_f80;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_f70,__l_09,&local_f89);
          local_fa8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_fa8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_fa8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_fa8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_fc8,(nullptr_t)0x0);
          local_f20[0] = Verify(pxVar3,&local_f38,&local_f70,&local_fa8,0,&local_fc8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_f18,"6",
                     "Verify(leaf.valid.get(), {root.bad_key.get()}, {intermediate.valid.get()}, {})"
                     ,local_f20 + 1,local_f20);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_fc8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_fa8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_f70);
          std::allocator<x509_st_*>::~allocator(&local_f89);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_f38);
          std::allocator<x509_st_*>::~allocator(&local_f51);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f18);
          if (!bVar1) {
            testing::Message::Message(&local_fd0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f18);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x120e,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_18.message_,&local_fd0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
            testing::Message::~Message(&local_fd0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_f18);
          local_ff0[1] = 6;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_1020 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&root.valid);
          local_1018 = &local_1020;
          local_1010 = 1;
          std::allocator<x509_st_*>::allocator(&local_1021);
          __l_08._M_len = local_1010;
          __l_08._M_array = local_1018;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1008,__l_08,&local_1021)
          ;
          local_1058 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
          local_1050 = &local_1058;
          local_1048 = 1;
          std::allocator<x509_st_*>::allocator(&local_1059);
          __l_07._M_len = local_1048;
          __l_07._M_array = local_1050;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1040,__l_07,&local_1059)
          ;
          local_1078.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1078.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1078.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_1078);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_1098,(nullptr_t)0x0);
          local_ff0[0] = Verify(pxVar3,&local_1008,&local_1040,&local_1078,0,&local_1098);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_fe8,"6",
                     "Verify(leaf.valid.get(), {root.bad_key_type.get()}, {intermediate.valid.get()}, {})"
                     ,local_ff0 + 1,local_ff0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_1098);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_1078);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1040);
          std::allocator<x509_st_*>::~allocator(&local_1059);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1008);
          std::allocator<x509_st_*>::~allocator(&local_1021);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fe8);
          if (!bVar1) {
            testing::Message::Message(&local_10a0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_fe8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1211,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_19.message_,&local_10a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
            testing::Message::~Message(&local_10a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_fe8);
          local_10c0[1] = 6;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_10f0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
          local_10e8 = &local_10f0;
          local_10e0 = 1;
          std::allocator<x509_st_*>::allocator(&local_10f1);
          __l_06._M_len = local_10e0;
          __l_06._M_array = local_10e8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_10d8,__l_06,&local_10f1)
          ;
          local_1128 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 (&intermediate.bad_key_type);
          local_1120 = &local_1128;
          local_1118 = 1;
          std::allocator<x509_st_*>::allocator(&local_1129);
          __l_05._M_len = local_1118;
          __l_05._M_array = local_1120;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1110,__l_05,&local_1129)
          ;
          local_1148.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1148.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1148.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_1148);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_1168,(nullptr_t)0x0);
          local_10c0[0] = Verify(pxVar3,&local_10d8,&local_1110,&local_1148,0,&local_1168);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_10b8,"6",
                     "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_key.get()}, {})"
                     ,local_10c0 + 1,local_10c0);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_1168);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_1148);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1110);
          std::allocator<x509_st_*>::~allocator(&local_1129);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_10d8);
          std::allocator<x509_st_*>::~allocator(&local_10f1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10b8);
          if (!bVar1) {
            testing::Message::Message(&local_1170);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1214,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_20.message_,&local_1170);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
            testing::Message::~Message(&local_1170);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_10b8);
          local_1190[1] = 6;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_11c0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
          local_11b8 = &local_11c0;
          local_11b0 = 1;
          std::allocator<x509_st_*>::allocator(&local_11c1);
          __l_04._M_len = local_11b0;
          __l_04._M_array = local_11b8;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_11a8,__l_04,&local_11c1)
          ;
          local_11f8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&intermediate.valid);
          local_11f0 = &local_11f8;
          local_11e8 = 1;
          std::allocator<x509_st_*>::allocator(&local_11f9);
          __l_03._M_len = local_11e8;
          __l_03._M_array = local_11f0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_11e0,__l_03,&local_11f9)
          ;
          local_1218.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1218.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1218.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_1218);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_1238,(nullptr_t)0x0);
          local_1190[0] = Verify(pxVar3,&local_11a8,&local_11e0,&local_1218,0,&local_1238);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1188,"6",
                     "Verify(leaf.valid.get(), {root.valid.get()}, {intermediate.bad_key_type.get()}, {})"
                     ,local_1190 + 1,local_1190);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_1238);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_1218);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_11e0);
          std::allocator<x509_st_*>::~allocator(&local_11f9);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_11a8);
          std::allocator<x509_st_*>::~allocator(&local_11c1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1188);
          if (!bVar1) {
            testing::Message::Message(&local_1240);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1188);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x1217,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_21.message_,&local_1240);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
            testing::Message::~Message(&local_1240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1188);
          local_1260[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.bad_key_type);
          local_1290 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
          local_1288 = &local_1290;
          local_1280 = 1;
          std::allocator<x509_st_*>::allocator(&local_1291);
          __l_02._M_len = local_1280;
          __l_02._M_array = local_1288;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1278,__l_02,&local_1291)
          ;
          local_12c8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
          local_12c0 = &local_12c8;
          local_12b8 = 1;
          std::allocator<x509_st_*>::allocator(&local_12c9);
          __l_01._M_len = local_12b8;
          __l_01._M_array = local_12c0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_12b0,__l_01,&local_12c9)
          ;
          local_12e8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_12e8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_12e8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_12e8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_1308,(nullptr_t)0x0);
          local_1260[0] = Verify(pxVar3,&local_1278,&local_12b0,&local_12e8,0,&local_1308);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1258,"0",
                     "Verify(leaf.bad_key.get(), {root.valid.get()}, {intermediate.valid.get()}, {})"
                     ,local_1260 + 1,local_1260);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_1308);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_12e8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_12b0);
          std::allocator<x509_st_*>::~allocator(&local_12c9);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1278);
          std::allocator<x509_st_*>::~allocator(&local_1291);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1258);
          if (!bVar1) {
            testing::Message::Message(&local_1310);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1258);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x121b,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_22.message_,&local_1310);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
            testing::Message::~Message(&local_1310);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1258);
          local_1330[1] = 0;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get(&leaf.valid);
          local_1360 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
          local_1358 = &local_1360;
          local_1350 = 1;
          std::allocator<x509_st_*>::allocator(&local_1361);
          __l_00._M_len = local_1350;
          __l_00._M_array = local_1358;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1348,__l_00,&local_1361)
          ;
          local_1398 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
          local_1390 = &local_1398;
          local_1388 = 1;
          std::allocator<x509_st_*>::allocator(&local_1399);
          __l._M_len = local_1388;
          __l._M_array = local_1390;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1380,__l,&local_1399);
          local_13b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_13b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_13b8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_13b8);
          std::function<void_(x509_store_ctx_st_*)>::function(&local_13d8,(nullptr_t)0x0);
          local_1330[0] = Verify(pxVar3,&local_1348,&local_1380,&local_13b8,0,&local_13d8);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1328,"0",
                     "Verify(leaf.bad_key_type.get(), {root.valid.get()}, {intermediate.valid.get()}, {})"
                     ,local_1330 + 1,local_1330);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_13d8);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_13b8);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1380);
          std::allocator<x509_st_*>::~allocator(&local_1399);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1348);
          std::allocator<x509_st_*>::~allocator(&local_1361);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1328);
          if (!bVar1) {
            testing::Message::Message(&local_13e0);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1328);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x121d,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_23.message_,&local_13e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
            testing::Message::~Message(&local_13e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1328);
          local_1400[1] = 0x15;
          pxVar3 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__3.message_)
          ;
          local_1418.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1418.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1418.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1418);
          local_1438.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1438.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1438.super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector(&local_1438);
          local_1458.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1458.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1458.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::vector(&local_1458);
          std::function<void(x509_store_ctx_st*)>::
          function<(anonymous_namespace)::X509Test_SignatureVerification_Test::TestBody()::__0,void>
                    ((function<void(x509_store_ctx_st*)> *)&local_1478,&local_1479);
          local_1400[0] = Verify(pxVar3,&local_1418,&local_1438,&local_1458,0,&local_1478);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_13f8,"21",
                     "Verify(leaf.valid.get(), {}, {}, {}, 0, [](X509_STORE_CTX *ctx) { X509_STORE_CTX_set_verify_cb( ctx, [](int ok, X509_STORE_CTX *ctx_inner) -> int { if (ok) { return ok; } int err = X509_STORE_CTX_get_error(ctx_inner); return err == 20; }); })"
                     ,local_1400 + 1,local_1400);
          std::function<void_(x509_store_ctx_st_*)>::~function(&local_1478);
          std::vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~vector(&local_1458);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1438);
          std::vector<x509_st_*,_std::allocator<x509_st_*>_>::~vector(&local_1418);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13f8);
          if (!bVar1) {
            testing::Message::Message(&local_1488);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_13f8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1490,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x122e,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1490,&local_1488);
            testing::internal::AssertHelper::~AssertHelper(&local_1490);
            testing::Message::~Message(&local_1488);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_13f8);
        }
        TestBody::Certs::~Certs((Certs *)&gtest_ar__3.message_);
      }
      TestBody::Certs::~Certs((Certs *)&gtest_ar__2.message_);
    }
    TestBody::Certs::~Certs((Certs *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, SignatureVerification) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  struct Certs {
    bssl::UniquePtr<X509> valid;
    bssl::UniquePtr<X509> bad_key_type, bad_key;
    bssl::UniquePtr<X509> bad_sig_type, bad_sig;
  };
  auto make_certs = [&](const char *issuer, const char *subject,
                        bool is_ca) -> Certs {
    Certs certs;
    certs.valid = MakeTestCert(issuer, subject, key.get(), is_ca);
    if (certs.valid == nullptr ||
        !X509_sign(certs.valid.get(), key.get(), EVP_sha256())) {
      return Certs{};
    }

    static const uint8_t kInvalid[] = {'i', 'n', 'v', 'a', 'l', 'i', 'd'};

    // Extracting the algorithm identifier from |certs.valid|'s SPKI, with
    // OpenSSL's API, is very tedious. Instead, we'll just rely on knowing it is
    // ecPublicKey with P-256 as parameters.
    const ASN1_BIT_STRING *pubkey = X509_get0_pubkey_bitstr(certs.valid.get());
    int pubkey_len = ASN1_STRING_length(pubkey);

    // Sign a copy of the certificate where the key type is an unsupported OID.
    bssl::UniquePtr<uint8_t> pubkey_data(static_cast<uint8_t *>(
        OPENSSL_memdup(ASN1_STRING_get0_data(pubkey), pubkey_len)));
    certs.bad_key_type = MakeTestCert(issuer, subject, key.get(), is_ca);
    if (pubkey_data == nullptr || certs.bad_key_type == nullptr ||
        !X509_PUBKEY_set0_param(X509_get_X509_PUBKEY(certs.bad_key_type.get()),
                                OBJ_nid2obj(NID_subject_alt_name), V_ASN1_UNDEF,
                                /*param_value=*/nullptr, pubkey_data.release(),
                                pubkey_len) ||
        !X509_sign(certs.bad_key_type.get(), key.get(), EVP_sha256())) {
      return Certs{};
    }

    // Sign a copy of the certificate where the key data is unparsable.
    pubkey_data.reset(
        static_cast<uint8_t *>(OPENSSL_memdup(kInvalid, sizeof(kInvalid))));
    certs.bad_key = MakeTestCert(issuer, subject, key.get(), is_ca);
    if (pubkey_data == nullptr || certs.bad_key == nullptr ||
        !X509_PUBKEY_set0_param(X509_get_X509_PUBKEY(certs.bad_key.get()),
                                OBJ_nid2obj(NID_X9_62_id_ecPublicKey),
                                V_ASN1_OBJECT,
                                OBJ_nid2obj(NID_X9_62_prime256v1),
                                pubkey_data.release(), sizeof(kInvalid)) ||
        !X509_sign(certs.bad_key.get(), key.get(), EVP_sha256())) {
      return Certs{};
    }

    bssl::UniquePtr<X509_ALGOR> wrong_algo(X509_ALGOR_new());
    if (wrong_algo == nullptr ||
        !X509_ALGOR_set0(wrong_algo.get(), OBJ_nid2obj(NID_subject_alt_name),
                         V_ASN1_NULL, nullptr)) {
      return Certs{};
    }

    certs.bad_sig_type.reset(X509_dup(certs.valid.get()));
    if (certs.bad_sig_type == nullptr ||
        !X509_set1_signature_algo(certs.bad_sig_type.get(), wrong_algo.get())) {
      return Certs{};
    }

    certs.bad_sig.reset(X509_dup(certs.valid.get()));
    if (certs.bad_sig == nullptr ||
        !X509_set1_signature_value(certs.bad_sig.get(), kInvalid,
                                   sizeof(kInvalid))) {
      return Certs{};
    }

    return certs;
  };

  Certs root(make_certs("Root", "Root", /*is_ca=*/true));
  ASSERT_TRUE(root.valid);
  Certs intermediate(make_certs("Root", "Intermediate", /*is_ca=*/true));
  ASSERT_TRUE(intermediate.valid);
  Certs leaf(make_certs("Intermediate", "Leaf", /*is_ca=*/false));
  ASSERT_TRUE(leaf.valid);

  // Check the base chain.
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.valid.get()},
                              {intermediate.valid.get()}, {}));

  // An invalid or unsupported signature in the leaf or intermediate is noticed.
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.bad_sig.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.bad_sig_type.get(), {root.valid.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_sig.get()}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_sig_type.get()}, {}));

  // By default, the redundant root signature is not checked.
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.bad_sig.get()},
                              {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {root.bad_sig_type.get()},
                              {intermediate.valid.get()}, {}));

  // The caller can request checking it, although it's pointless.
  EXPECT_EQ(
      X509_V_ERR_CERT_SIGNATURE_FAILURE,
      Verify(leaf.valid.get(), {root.bad_sig.get()}, {intermediate.valid.get()},
             {}, X509_V_FLAG_CHECK_SS_SIGNATURE));
  EXPECT_EQ(
      X509_V_ERR_CERT_SIGNATURE_FAILURE,
      Verify(leaf.valid.get(), {root.bad_sig_type.get()},
             {intermediate.valid.get()}, {}, X509_V_FLAG_CHECK_SS_SIGNATURE));

  // The above also applies when accepting a trusted, self-signed root as the
  // target certificate.
  EXPECT_EQ(X509_V_OK,
            Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {}));
  EXPECT_EQ(X509_V_OK,
            Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {}));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(root.bad_sig.get(), {root.bad_sig.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE));
  EXPECT_EQ(X509_V_ERR_CERT_SIGNATURE_FAILURE,
            Verify(root.bad_sig_type.get(), {root.bad_sig_type.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE));

  // If an intermediate is a trust anchor, the redundant signature is always
  // ignored, even with |X509_V_FLAG_CHECK_SS_SIGNATURE|. (We cannot check the
  // signature without the key.)
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.valid.get(), {intermediate.bad_sig.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE | X509_V_FLAG_PARTIAL_CHAIN));
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {},
                   X509_V_FLAG_CHECK_SS_SIGNATURE | X509_V_FLAG_PARTIAL_CHAIN));
  EXPECT_EQ(X509_V_OK, Verify(leaf.valid.get(), {intermediate.bad_sig.get()},
                              {}, {}, X509_V_FLAG_PARTIAL_CHAIN));
  EXPECT_EQ(X509_V_OK,
            Verify(leaf.valid.get(), {intermediate.bad_sig_type.get()}, {}, {},
                   X509_V_FLAG_PARTIAL_CHAIN));

  // Bad keys in the root and intermediate are rejected.
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.bad_key.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.bad_key_type.get()},
                   {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_key.get()}, {}));
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_DECODE_ISSUER_PUBLIC_KEY,
            Verify(leaf.valid.get(), {root.valid.get()},
                   {intermediate.bad_key_type.get()}, {}));

  // Bad keys in the leaf are ignored. The leaf's key is used by the caller.
  EXPECT_EQ(X509_V_OK, Verify(leaf.bad_key.get(), {root.valid.get()},
                              {intermediate.valid.get()}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.bad_key_type.get(), {root.valid.get()},
                              {intermediate.valid.get()}, {}));

  // At the time we go to verify signatures, it is possible that we have a
  // single-element certificate chain with a certificate that isn't self-signed.
  // This does not seem to be reachable except if missing trust anchors are
  // suppressed with the verify callback, but exercise this codepath anyway.
  EXPECT_EQ(X509_V_ERR_UNABLE_TO_VERIFY_LEAF_SIGNATURE,
            Verify(leaf.valid.get(), {}, {}, {}, 0, [](X509_STORE_CTX *ctx) {
              X509_STORE_CTX_set_verify_cb(
                  ctx, [](int ok, X509_STORE_CTX *ctx_inner) -> int {
                    if (ok) {
                      return ok;
                    }
                    // Suppress the missing issuer certificate.
                    int err = X509_STORE_CTX_get_error(ctx_inner);
                    return err == X509_V_ERR_UNABLE_TO_GET_ISSUER_CERT_LOCALLY;
                  });
            }));
}